

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall cnn::Model::reset_gradient(Model *this)

{
  bool bVar1;
  __normal_iterator<cnn::Parameters_**,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
  *in_RDI;
  LookupParameters *p_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *__range1_1;
  Parameters *p;
  iterator __end1;
  iterator __begin1;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *__range1;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<cnn::LookupParameters_**,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
  local_38;
  LookupParameters *this_00;
  __normal_iterator<cnn::Parameters_**,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
  local_18;
  __normal_iterator<cnn::Parameters_**,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
  *local_10;
  
  local_10 = in_RDI + 3;
  local_18._M_current =
       (Parameters **)
       std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::begin
                 ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                  in_stack_ffffffffffffffa8);
  std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::end
            ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
             in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<cnn::Parameters_**,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<cnn::Parameters_**,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
    ::operator*(&local_18);
    Parameters::clear((Parameters *)0x5f3e2b);
    __gnu_cxx::
    __normal_iterator<cnn::Parameters_**,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
    ::operator++(&local_18);
  }
  this_00 = (LookupParameters *)(in_RDI + 6);
  local_38._M_current =
       (LookupParameters **)
       std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::begin
                 (in_stack_ffffffffffffffa8);
  std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::end
            (in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::LookupParameters_**,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<cnn::LookupParameters_**,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<cnn::LookupParameters_**,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
    ::operator*(&local_38);
    LookupParameters::clear(this_00);
    __gnu_cxx::
    __normal_iterator<cnn::LookupParameters_**,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void Model::reset_gradient() {
  for (auto p : params) { p->clear(); }
  for (auto p : lookup_params) { p->clear(); }
}